

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QCommonArrayOps<ProString>::growAppend
          (QCommonArrayOps<ProString> *this,ProString *b,ProString *e)

{
  long n;
  ProString *pPVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<ProString> local_48;
  ProString *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = b;
  if (b != e) {
    n = ((long)e - (long)b >> 4) * -0x5555555555555555;
    local_48.d = (Data *)0x0;
    local_48.ptr = (ProString *)0x0;
    local_48.size = 0;
    pPVar1 = (this->super_Type).super_QGenericArrayOps<ProString>.super_QArrayDataPointer<ProString>
             .ptr;
    if ((b < pPVar1) ||
       (pPVar1 + (this->super_Type).super_QGenericArrayOps<ProString>.
                 super_QArrayDataPointer<ProString>.size <= b)) {
      QArrayDataPointer<ProString>::detachAndGrow
                ((QArrayDataPointer<ProString> *)this,GrowsAtEnd,n,(ProString **)0x0,
                 (QArrayDataPointer<ProString> *)0x0);
      pPVar1 = b;
    }
    else {
      QArrayDataPointer<ProString>::detachAndGrow
                ((QArrayDataPointer<ProString> *)this,GrowsAtEnd,n,&local_28,&local_48);
      pPVar1 = local_28;
    }
    QGenericArrayOps<ProString>::copyAppend
              ((QGenericArrayOps<ProString> *)this,pPVar1,
               (ProString *)(((long)e - (long)b) + (long)pPVar1));
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }